

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

int Debug::print(char *str)

{
  int iVar1;
  
  iVar1 = fputs(str,_stderr);
  return iVar1;
}

Assistant:

int Debug::print(const char* str)
{
#ifdef _MSC_VER
  OutputDebugString(str);
  return (int)strlen(str);
#else
  return fputs(str, stderr);
#endif
}